

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-game.c
# Opt level: O3

_Bool got_savefile(savefile_getter *pg)

{
  _Bool _Var1;
  savefile_getter psVar2;
  ang_dir *paVar3;
  char *pcVar4;
  char *pcVar5;
  char fname [256];
  char path [1024];
  char acStack_528 [256];
  char local_428 [1032];
  
  psVar2 = *pg;
  if (psVar2 == (savefile_getter)0x0) {
    psVar2 = (savefile_getter)mem_zalloc(0x28);
    *pg = psVar2;
    safe_setuid_grab();
    paVar3 = my_dopen(ANGBAND_DIR_SAVE);
    (*pg)->d = paVar3;
    safe_setuid_drop();
    psVar2 = *pg;
    if (psVar2->d == (ang_dir *)0x0) {
      return false;
    }
    psVar2->have_savedir = true;
    (psVar2->details).foff = 0;
  }
  else if (psVar2->d == (ang_dir *)0x0) {
    if (psVar2->have_details != true) {
      return false;
    }
    __assert_fail("!(*pg)->have_details",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-game.c"
                  ,0x4a7,"_Bool got_savefile(savefile_getter *)");
  }
  safe_setuid_grab();
  _Var1 = my_dread((*pg)->d,acStack_528,0x100);
  safe_setuid_drop();
  if (!_Var1) {
    my_dclose((*pg)->d);
    (*pg)->d = (ang_dir *)0x0;
    (*pg)->have_details = false;
    return false;
  }
  path_build(local_428,0x400,ANGBAND_DIR_SAVE,acStack_528);
  pcVar4 = savefile_get_description(local_428);
  string_free(((*pg)->details).fnam);
  pcVar5 = string_make(acStack_528);
  ((*pg)->details).fnam = pcVar5;
  string_free(((*pg)->details).desc);
  pcVar4 = string_make(pcVar4);
  ((*pg)->details).desc = pcVar4;
  (*pg)->have_details = true;
  return true;
}

Assistant:

bool got_savefile(savefile_getter *pg)
{
	char fname[256];

	if (*pg == NULL) {
		/* Initialize the enumeration. */
		*pg = mem_zalloc(sizeof(**pg));
		/* Need enhanced privileges to read from the save directory. */
		safe_setuid_grab();
		(*pg)->d = my_dopen(ANGBAND_DIR_SAVE);
		safe_setuid_drop();
		if (!(*pg)->d) {
			return false;
		}
		(*pg)->have_savedir = true;
		/*
		 * Set up the user-specific prefix.  Mimics savefile_set_name().
		 */
#ifdef SETGID
		strnfmt((*pg)->uid_c, sizeof((*pg)->uid_c), "%d.", player_uid);
		(*pg)->details.foff = strlen((*pg)->uid_c);
#else
		(*pg)->details.foff = 0;
#endif
	} else {
		if (!(*pg)->d) {
			assert(!(*pg)->have_details);
			return false;
		}
	}

	while (1) {
		char path[1024];
		const char *desc;
		bool no_entry;

		/*
		 * Also need elevated privileges for the file attribute queries
		 * in my_dread().
		 */
		safe_setuid_grab();
		no_entry = !my_dread((*pg)->d, fname, sizeof(fname));
		safe_setuid_drop();
		if (no_entry) {
			break;
		}

#ifdef SETGID
		/* Check that the savefile name begins with the user's ID. */
		if (!prefix(fname, (*pg)->uid_c)) {
			continue;
		}
#endif

		path_build(path, sizeof(path), ANGBAND_DIR_SAVE, fname);
		desc = savefile_get_description(path);
		string_free((*pg)->details.fnam);
		(*pg)->details.fnam = string_make(fname);
		string_free((*pg)->details.desc);
		(*pg)->details.desc = string_make(desc);
		(*pg)->have_details = true;
		return true;
	}

	my_dclose((*pg)->d);
	(*pg)->d = NULL;
	(*pg)->have_details = false;

	return false;
}